

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

Maybe<kj::Own<const_kj::ReadableFile,_std::nullptr_t>_> __thiscall
kj::anon_unknown_59::InMemoryDirectory::tryOpenFile(InMemoryDirectory *this,PathPtr path)

{
  long lVar1;
  Disposer DVar2;
  int __flags;
  long in_RCX;
  undefined8 *puVar3;
  ReadableFile *extraout_RDX;
  void *__child_stack;
  char *pcVar4;
  ReadableFile *extraout_RDX_00;
  ReadableFile *extraout_RDX_01;
  ReadableFile *pRVar5;
  void *in_R8;
  Maybe<kj::Own<const_kj::ReadableFile,_std::nullptr_t>_> MVar6;
  StringPtr name;
  StringPtr name_00;
  PathPtr path_00;
  Fault f;
  Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> lock;
  Array<kj::String> local_58;
  FsNode local_38;
  Disposer local_30;
  
  puVar3 = (undefined8 *)path.parts.size_;
  name_00.content.ptr = path.parts.ptr;
  if (in_RCX == 1) {
    MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::lockShared
              ((MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)
               &stack0xffffffffffffffc8,name_00.content.ptr + 1);
    lVar1 = puVar3[1];
    if (lVar1 == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (char *)*puVar3;
    }
    __flags = (int)lVar1 + (uint)(lVar1 == 0);
    name.content.size_ = (size_t)pcVar4;
    name.content.ptr = (char *)local_30._vptr_Disposer;
    Impl::tryGetEntry((Impl *)&local_58,name);
    if ((Clock *)local_58.ptr == (Clock *)0x0) {
      (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode = (_func_int **)0x0;
      (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
    }
    else if (*(int *)((long)local_58.ptr + 0x18) == 3) {
      SymlinkNode::parse((Path *)&local_58,(SymlinkNode *)((long)local_58.ptr + 0x20));
      Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl>::release
                ((Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)
                 &stack0xffffffffffffffc8);
      path_00.parts.size_ = (size_t)local_58.ptr;
      path_00.parts.ptr = name_00.content.ptr;
      tryOpenFile(this,path_00);
      Array<kj::String>::~Array(&local_58);
    }
    else if (*(int *)((long)local_58.ptr + 0x18) == 1) {
      File::clone((File *)&local_58,(__fn *)*(ArrayDisposer **)((long)local_58.ptr + 0x28),
                  __child_stack,__flags,in_R8);
      (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
           (_func_int **)local_58.ptr;
      (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)local_58.size_;
      local_58.size_ = 0;
      Own<const_kj::File,_std::nullptr_t>::dispose((Own<const_kj::File,_std::nullptr_t> *)&local_58)
      ;
    }
    else {
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[11]>
                ((Fault *)&local_58,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x695,FAILED,(char *)0x0,"\"not a file\"",(char (*) [11])"not a file");
      (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode = (_func_int **)0x0;
      (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
      _::Debug::Fault::~Fault((Fault *)&local_58);
    }
    Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl>::~Locked
              ((Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)
               &stack0xffffffffffffffc8);
    pRVar5 = extraout_RDX_01;
  }
  else if (in_RCX == 0) {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[11]>
              ((Fault *)&local_58,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
               ,0x439,FAILED,(char *)0x0,"\"not a file\"",(char (*) [11])"not a file");
    (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode = (_func_int **)0x0;
    (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
    _::Debug::Fault::~Fault((Fault *)&local_58);
    pRVar5 = extraout_RDX;
  }
  else {
    if (puVar3[1] == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (char *)*puVar3;
    }
    name_00.content.size_ = (size_t)pcVar4;
    tryGetParent((InMemoryDirectory *)&stack0xffffffffffffffc8,name_00);
    DVar2._vptr_Disposer = local_30._vptr_Disposer;
    local_58.ptr = (String *)local_38._vptr_FsNode;
    local_58.size_ = (size_t)local_30._vptr_Disposer;
    local_30._vptr_Disposer = (_func_int **)0x0;
    Own<const_kj::ReadableDirectory,_std::nullptr_t>::dispose
              ((Own<const_kj::ReadableDirectory,_std::nullptr_t> *)&stack0xffffffffffffffc8);
    if ((Waiter *)DVar2._vptr_Disposer == (Waiter *)0x0) {
      (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode = (_func_int **)0x0;
      (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
    }
    else {
      (**(code **)(*DVar2._vptr_Disposer + 0x50))(this,DVar2._vptr_Disposer,puVar3 + 3,in_RCX + -1);
    }
    Own<const_kj::ReadableDirectory,_std::nullptr_t>::dispose
              ((Own<const_kj::ReadableDirectory,_std::nullptr_t> *)&local_58);
    pRVar5 = extraout_RDX_00;
  }
  MVar6.ptr.ptr = pRVar5;
  MVar6.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<const_kj::ReadableFile,_std::nullptr_t>_>)MVar6.ptr;
}

Assistant:

Maybe<Own<const ReadableFile>> tryOpenFile(PathPtr path) const override {
    if (path.size() == 0) {
      KJ_FAIL_REQUIRE("not a file") { return kj::none; }
    } else if (path.size() == 1) {
      auto lock = impl.lockShared();
      KJ_IF_SOME(entry, lock->tryGetEntry(path[0])) {
        return asFile(lock, entry);
      } else {
        return kj::none;
      }
    }